

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::Logger::isValidId(string *id)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  size_type sVar5;
  
  pcVar1 = (id->_M_dataplus)._M_p;
  sVar2 = id->_M_string_length;
  sVar3 = 0;
  do {
    sVar5 = sVar3;
    if (sVar2 == sVar5) break;
    bVar4 = base::utils::Str::contains
                      ("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789-._",
                       pcVar1[sVar5]);
    sVar3 = sVar5 + 1;
  } while (bVar4);
  return sVar2 == sVar5;
}

Assistant:

Configurations::Configurations(void) :
  m_configurationFile(std::string()),
  m_isFromFile(false) {
}